

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *os,color3f *v)

{
  size_t sVar1;
  ostream *poVar2;
  char buf [24];
  char buf_1 [24];
  char buf_2 [24];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  char local_48 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  sVar1 = floaxie::ftoa<float,char>(v->r,(char *)&local_a8);
  local_68 = local_58;
  __cxx11::string::_M_construct<char*>((string *)&local_68,&local_a8,(long)&local_a8 + sVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_68,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  sVar1 = floaxie::ftoa<float,char>(v->g,(char *)&local_88);
  local_a8 = local_98;
  __cxx11::string::_M_construct<char*>((string *)&local_a8,&local_88,(long)&local_88 + sVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_a8,local_a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  sVar1 = floaxie::ftoa<float,char>(v->b,local_48);
  local_88 = local_78;
  __cxx11::string::_M_construct<char*>((string *)&local_88,local_48,local_48 + sVar1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_88,local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::color3f &v) {
  os << "(" << tinyusdz::dtos(v.r) << ", " << tinyusdz::dtos(v.g) << ", "
     << tinyusdz::dtos(v.b) << ")";
  return os;
}